

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorypool.h
# Opt level: O2

void __thiscall
despot::MemoryPool<despot::TagState>::~MemoryPool(MemoryPool<despot::TagState> *this)

{
  DeleteAll(this);
  std::_Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>::~_Vector_base
            (&(this->freelist_).
              super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>);
  std::
  _Vector_base<despot::MemoryPool<despot::TagState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::TagState>::Chunk_*>_>
  ::~_Vector_base((_Vector_base<despot::MemoryPool<despot::TagState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::TagState>::Chunk_*>_>
                   *)this);
  return;
}

Assistant:

~MemoryPool() {
		DeleteAll();
	}